

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::STLImporter::CanRead(STLImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [2];
  string local_58;
  char *local_38;
  char *pcStack_30;
  
  BaseImporter::GetExtension(&local_58,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  bVar1 = true;
  if (iVar2 != 0) {
    if (local_58._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        local_38 = "STL";
        pcStack_30 = "solid";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_38,2,200,false,false)
        ;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool STLImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);

    if( extension == "stl" ) {
        return true;
    } else if (!extension.length() || checkSig)   {
        if( !pIOHandler ) {
            return true;
        }
        const char* tokens[] = {"STL","solid"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,2);
    }

    return false;
}